

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

BuiltinFuncInfo *
deqp::gles3::Functional::BuiltinOperInfo
          (BuiltinFuncInfo *__return_storage_ptr__,char *caseName_,char *shaderFuncName_,
          ValueType outValue_,Value input0_,Value input1_,Value input2_,FloatScalar *resultScale_,
          FloatScalar *resultBias_,deUint32 precisionMask_,ShaderEvalFunc evalFuncScalar_,
          ShaderEvalFunc evalFuncVec2_,ShaderEvalFunc evalFuncVec3_,ShaderEvalFunc evalFuncVec4_)

{
  FloatScalar FVar1;
  FloatScalar FVar2;
  
  (__return_storage_ptr__->input1).rangeMax.m_value = input1_.rangeMax.m_value;
  (__return_storage_ptr__->input1).valueType = input1_.valueType;
  (__return_storage_ptr__->input1).rangeMin.m_isConstant = input1_.rangeMin.m_isConstant;
  *(undefined3 *)&(__return_storage_ptr__->input1).rangeMin.field_0x1 = input1_.rangeMin._1_3_;
  *(undefined8 *)&(__return_storage_ptr__->input1).rangeMin.m_value = input1_._8_8_;
  __return_storage_ptr__->caseName = caseName_;
  __return_storage_ptr__->shaderFuncName = shaderFuncName_;
  __return_storage_ptr__->outValue = outValue_;
  (__return_storage_ptr__->input0).rangeMax.m_value = input0_.rangeMax.m_value;
  (__return_storage_ptr__->input0).valueType = input0_.valueType;
  (__return_storage_ptr__->input0).rangeMin.m_isConstant = input0_.rangeMin.m_isConstant;
  *(undefined3 *)&(__return_storage_ptr__->input0).rangeMin.field_0x1 = input0_.rangeMin._1_3_;
  *(undefined8 *)&(__return_storage_ptr__->input0).rangeMin.m_value = input0_._8_8_;
  (__return_storage_ptr__->input2).valueType = input2_.valueType;
  (__return_storage_ptr__->input2).rangeMin.m_isConstant = input2_.rangeMin.m_isConstant;
  *(undefined3 *)&(__return_storage_ptr__->input2).rangeMin.field_0x1 = input2_.rangeMin._1_3_;
  *(undefined8 *)&(__return_storage_ptr__->input2).rangeMin.m_value = input2_._8_8_;
  (__return_storage_ptr__->input2).rangeMax.m_value = input2_.rangeMax.m_value;
  FVar1 = *resultScale_;
  __return_storage_ptr__->resultScale = FVar1;
  FVar2 = *resultBias_;
  __return_storage_ptr__->resultBias = FVar2;
  __return_storage_ptr__->referenceScale = FVar1;
  __return_storage_ptr__->referenceBias = FVar2;
  __return_storage_ptr__->precisionMask = precisionMask_;
  __return_storage_ptr__->evalFuncScalar = evalFuncScalar_;
  __return_storage_ptr__->evalFuncVec2 = evalFuncVec2_;
  __return_storage_ptr__->evalFuncVec3 = evalFuncVec3_;
  __return_storage_ptr__->evalFuncVec4 = evalFuncVec4_;
  __return_storage_ptr__->type = OPERATOR;
  __return_storage_ptr__->isUnaryPrefix = true;
  return __return_storage_ptr__;
}

Assistant:

static inline BuiltinFuncInfo BuiltinOperInfo (const char* caseName_, const char* shaderFuncName_, ValueType outValue_, Value input0_, Value input1_, Value input2_, const FloatScalar& resultScale_, const FloatScalar& resultBias_, deUint32 precisionMask_, ShaderEvalFunc evalFuncScalar_, ShaderEvalFunc evalFuncVec2_, ShaderEvalFunc evalFuncVec3_, ShaderEvalFunc evalFuncVec4_)
{
	return BuiltinFuncInfo(caseName_, shaderFuncName_, outValue_, input0_, input1_, input2_, resultScale_, resultBias_, resultScale_, resultBias_, precisionMask_, evalFuncScalar_, evalFuncVec2_, evalFuncVec3_, evalFuncVec4_, OPERATOR);
}